

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O2

void __thiscall jaegertracing::net::URI_testMatch_Test::TestBody(URI_testMatch_Test *this)

{
  char *pcVar1;
  allocator local_c5;
  int local_c4;
  AssertionResult gtest_ar;
  string local_b0 [32];
  string local_90 [64];
  int local_50 [18];
  
  local_c4 = 0;
  std::__cxx11::string::string(local_b0,"http://localhost",&local_c5);
  jaegertracing::net::URI::parse(local_90);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","URI::parse(\"http://localhost\")._port",&local_c4,local_50);
  URI::~URI((URI *)local_90);
  std::__cxx11::string::~string(local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x1e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_c4 = 0x50;
    std::__cxx11::string::string(local_b0,"http://localhost:80",&local_c5);
    jaegertracing::net::URI::parse(local_90);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"80","URI::parse(\"http://localhost:80\")._port",&local_c4,
               local_50);
    URI::~URI((URI *)local_90);
    std::__cxx11::string::~string(local_b0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)local_90);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x1f,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_90);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(URI, testMatch)
{
    ASSERT_EQ(0, URI::parse("http://localhost")._port);
    ASSERT_EQ(80, URI::parse("http://localhost:80")._port);
}